

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.h
# Opt level: O1

int64_t __thiscall ArgParser::ArgIterator::getint(ArgIterator *this)

{
  logic_error *this_00;
  pair<long,_const_char_*> pVar1;
  
  getstr(this);
  pVar1 = parsesigned<char_const*>(this->p,this->pend,0);
  if (pVar1.second == this->pend) {
    return pVar1.first;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"characters trailing number");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

int64_t getint()
        {
            getstr(); // ignoring result, we use 'p' directly.

            auto res = parsesigned(p, pend, 0);
            if (res.second != pend)
                throw std::logic_error("characters trailing number");
            return res.first;
        }